

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on(void *param_1)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  printer *this;
  printer *t;
  printer *t_00;
  printer *this_00;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  printer *this_01;
  printer *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char (*in_stack_ffffffffffffff18) [82];
  printer *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  printer *in_stack_ffffffffffffff30;
  string local_50 [39];
  undefined1 local_29;
  long local_28;
  undefined1 local_19;
  long local_18;
  void *local_10;
  
  if (on::once) {
    on::once = false;
    local_10 = param_1;
    if ((*(long *)((long)param_1 + 8) == 0) && (*(long *)((long)param_1 + 0x20) == 0)) {
      printer::colors((printer *)((long)param_1 + 0x30));
      __str._M_str = (char *)in_stack_ffffffffffffff20;
      __str._M_len = (size_t)in_stack_ffffffffffffff18;
      pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffff10,__str);
      poVar1 = std::operator<<(pbVar2,"All tests passed");
      printer::colors((printer *)((long)param_1 + 0x30));
      __str_00._M_str = (char *)in_stack_ffffffffffffff20;
      __str_00._M_len = (size_t)in_stack_ffffffffffffff18;
      pbVar2 = std::operator<<(poVar1,__str_00);
      poVar1 = std::operator<<(pbVar2," (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)((long)param_1 + 0x18));
      poVar1 = std::operator<<(poVar1," asserts in ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*param_1);
      std::operator<<(poVar1," tests)\n");
      if (*(long *)((long)param_1 + 0x10) != 0) {
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*(ulong *)((long)param_1 + 0x10));
        std::operator<<(poVar1," tests skipped\n");
      }
      std::ostream::flush();
    }
    else {
      this_01 = (printer *)((long)param_1 + 0x30);
      printer::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      printer::operator<<(in_stack_ffffffffffffff20,(char (*) [10])in_stack_ffffffffffffff18);
      this = (printer *)((long)param_1 + 8);
      local_18 = *param_1 + *(long *)((long)param_1 + 8);
      printer::operator<<(this,(unsigned_long *)in_stack_ffffffffffffff18);
      t = printer::operator<<(this,(char (*) [4])in_stack_ffffffffffffff18);
      printer::colors(this_01);
      printer::operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      printer::operator<<(this,(unsigned_long *)t);
      t_00 = printer::operator<<(this,(char (*) [8])t);
      printer::colors(this_01);
      printer::operator<<(in_stack_ffffffffffffff30,
                          (basic_string_view<char,_std::char_traits<char>_> *)t_00);
      local_19 = 10;
      printer::operator<<(this,(char *)t);
      printer::operator<<(this,(char (*) [10])t);
      this_00 = (printer *)((long)param_1 + 0x18);
      local_28 = *(long *)((long)param_1 + 0x18) + *(long *)((long)param_1 + 0x20);
      printer::operator<<(this,(unsigned_long *)t);
      printer::operator<<(this,(char (*) [4])t);
      printer::operator<<(this,(unsigned_long *)t);
      printer::operator<<(this,(char (*) [8])t);
      printer::operator<<(this,(char (*) [4])t);
      printer::colors(this_01);
      printer::operator<<(this_00,(basic_string_view<char,_std::char_traits<char>_> *)t_00);
      printer::operator<<(this,(unsigned_long *)t);
      printer::operator<<(this,(char (*) [8])t);
      printer::colors(this_01);
      printer::operator<<(this_00,(basic_string_view<char,_std::char_traits<char>_> *)t_00);
      local_29 = 10;
      printer::operator<<(this,(char *)t);
      printer::str_abi_cxx11_(in_stack_ffffffffffffff08);
      poVar1 = std::operator<<((ostream *)&std::cerr,local_50);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    }
  }
  return;
}

Assistant:

auto on(events::summary) -> void {
      if (static auto once = true; once) {
        once = false;
        if (tests_.fail or asserts_.fail) {
          printer_
              << "\n========================================================"
                 "=======================\n"
              << "tests:   " << (tests_.pass + tests_.fail) << " | "
              << printer_.colors().fail << tests_.fail << " failed"
              << printer_.colors().none << '\n'
              << "asserts: " << (asserts_.pass + asserts_.fail) << " | "
              << asserts_.pass << " passed"
              << " | " << printer_.colors().fail << asserts_.fail << " failed"
              << printer_.colors().none << '\n';
          std::cerr << printer_.str() << std::endl;
        } else {
          std::cout << printer_.colors().pass << "All tests passed"
                    << printer_.colors().none << " (" << asserts_.pass
                    << " asserts in " << tests_.pass << " tests)\n";

          if (tests_.skip) {
            std::cout << tests_.skip << " tests skipped\n";
          }

          std::cout.flush();
        }
      }
    }